

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O1

slist * gen_load_absoffsetrel
                  (compiler_state_t *cstate,bpf_abs_offset *abs_offset,u_int offset,u_int size)

{
  slist *psVar1;
  slist *p;
  slist *psVar2;
  slist *psVar3;
  slist *psVar4;
  
  psVar2 = gen_abs_offset_varpart(cstate,abs_offset);
  psVar3 = (slist *)newchunk(cstate,0x28);
  if (psVar2 == (slist *)0x0) {
    (psVar3->s).code = size | 0x20;
    (psVar3->s).k = offset + abs_offset->constant_part;
  }
  else {
    (psVar3->s).code = size | 0x40;
    (psVar3->s).k = offset + abs_offset->constant_part;
    psVar1 = psVar2;
    do {
      psVar4 = psVar1;
      psVar1 = psVar4->next;
    } while (psVar1 != (slist *)0x0);
    psVar4->next = psVar3;
    psVar3 = psVar2;
  }
  return psVar3;
}

Assistant:

static struct slist *
gen_load_absoffsetrel(compiler_state_t *cstate, bpf_abs_offset *abs_offset,
    u_int offset, u_int size)
{
	struct slist *s, *s2;

	s = gen_abs_offset_varpart(cstate, abs_offset);

	/*
	 * If "s" is non-null, it has code to arrange that the X register
	 * contains the variable part of the absolute offset, so we
	 * generate a load relative to that, with an offset of
	 * abs_offset->constant_part + offset.
	 *
	 * Otherwise, we can do an absolute load with an offset of
	 * abs_offset->constant_part + offset.
	 */
	if (s != NULL) {
		/*
		 * "s" points to a list of statements that puts the
		 * variable part of the absolute offset into the X register.
		 * Do an indirect load, to use the X register as an offset.
		 */
		s2 = new_stmt(cstate, BPF_LD|BPF_IND|size);
		s2->s.k = abs_offset->constant_part + offset;
		sappend(s, s2);
	} else {
		/*
		 * There is no variable part of the absolute offset, so
		 * just do an absolute load.
		 */
		s = new_stmt(cstate, BPF_LD|BPF_ABS|size);
		s->s.k = abs_offset->constant_part + offset;
	}
	return s;
}